

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

void __thiscall
bloaty::anon_unknown_0::ElfFile::ReadSegment(ElfFile *this,Elf64_Word index,Segment *segment)

{
  Elf64_Off *pEVar1;
  char **out_str;
  char *buffer;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint64_t n;
  ulong uVar11;
  ulong offset;
  Nonnull<char_*> pcVar12;
  size_t sVar13;
  Arg *in_R9;
  string_view sVar14;
  string_view format;
  StructReader local_98 [2];
  string local_68;
  Arg local_48;
  
  if ((this->header_).e_phnum <= index) {
    out_str = &local_98[0].data_._M_str;
    pcVar12 = absl::numbers_internal::FastIntToBuffer(index,(Nonnull<char_*>)out_str);
    local_98[0].elf_ = (ElfFile *)(pcVar12 + -(long)out_str);
    buffer = local_48.scratch_;
    local_98[0].data_._M_len = (size_t)out_str;
    pcVar12 = absl::numbers_internal::FastIntToBuffer((uint)(this->header_).e_phnum,buffer);
    local_48.piece_._M_len = (long)pcVar12 - (long)buffer;
    format._M_str = (char *)local_98;
    format._M_len = (size_t)"segment $0 doesn\'t exist, only $1 segments";
    local_48.piece_._M_str = buffer;
    absl::Substitute_abi_cxx11_(&local_68,(absl *)0x2a,format,&local_48,in_R9);
    Throw(local_68._M_dataplus._M_p,0x20e);
  }
  uVar11 = (ulong)(this->header_).e_phentsize * (ulong)index;
  pEVar1 = &(this->header_).e_phoff;
  offset = uVar11 + *pEVar1;
  if (CARRY8(uVar11,*pEVar1)) {
LAB_00198dfd:
    Throw("integer overflow in addition",0x4b);
  }
  local_98[0].data_._M_len = (this->data_)._M_len;
  local_98[0].data_._M_str = (this->data_)._M_str;
  local_98[0].elf_ = this;
  if (this->is_64bit_ == true) {
    bVar2 = this->is_native_endian_;
    StructReader::Memcpy<Elf64_Phdr>(local_98,offset,&segment->range_,&segment->header_);
    if (bVar2 != false) goto LAB_00198dd4;
    uVar3 = (segment->header_).p_type;
    uVar4 = (segment->header_).p_flags;
    (segment->header_).p_type =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    (segment->header_).p_flags =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar11 = (segment->header_).p_offset;
    (segment->header_).p_offset =
         uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    uVar11 = (segment->header_).p_vaddr;
    (segment->header_).p_vaddr =
         uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    uVar11 = (segment->header_).p_paddr;
    (segment->header_).p_paddr =
         uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    uVar11 = (segment->header_).p_filesz;
    (segment->header_).p_filesz =
         uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    uVar11 = (segment->header_).p_memsz;
    (segment->header_).p_memsz =
         uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    uVar11 = (segment->header_).p_align;
    uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
             uVar11 << 0x38;
  }
  else {
    if (0xffffffffffffffdf < offset) goto LAB_00198dfd;
    if (local_98[0].data_._M_len < offset + 0x20) {
      Throw("region out-of-bounds",0x5d);
    }
    if (local_98[0].data_._M_len < offset) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 offset);
    }
    sVar13 = 0x20;
    if (local_98[0].data_._M_len - offset < 0x20) {
      sVar13 = local_98[0].data_._M_len - offset;
    }
    (segment->range_)._M_len = sVar13;
    (segment->range_)._M_str = local_98[0].data_._M_str + offset;
    uVar3 = *(uint *)(local_98[0].data_._M_str + offset);
    uVar4 = *(uint *)(local_98[0].data_._M_str + offset + 4);
    uVar5 = *(uint *)(local_98[0].data_._M_str + offset + 8);
    uVar6 = *(uint *)(local_98[0].data_._M_str + offset + 0xc);
    uVar7 = *(uint *)(local_98[0].data_._M_str + offset + 0x10);
    uVar8 = *(uint *)(local_98[0].data_._M_str + offset + 0x14);
    uVar9 = *(uint *)(local_98[0].data_._M_str + offset + 0x18);
    uVar10 = *(uint *)(local_98[0].data_._M_str + offset + 0x1c);
    uVar11 = (ulong)uVar10;
    if (this->is_native_endian_ == true) {
      (segment->header_).p_type = uVar3;
      (segment->header_).p_flags = uVar9;
      (segment->header_).p_offset = (ulong)uVar4;
      (segment->header_).p_vaddr = (ulong)uVar5;
      (segment->header_).p_paddr = (ulong)uVar6;
      (segment->header_).p_filesz = (ulong)uVar7;
      (segment->header_).p_memsz = (ulong)uVar8;
    }
    else {
      (segment->header_).p_type =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      (segment->header_).p_flags =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      (segment->header_).p_offset =
           (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
      (segment->header_).p_vaddr =
           (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
      (segment->header_).p_paddr =
           (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18);
      (segment->header_).p_filesz =
           (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
      (segment->header_).p_memsz =
           (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
      uVar11 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                      uVar10 << 0x18);
    }
  }
  (segment->header_).p_align = uVar11;
LAB_00198dd4:
  n = (segment->header_).p_filesz;
  if (n != 0) {
    sVar14 = GetRegion(this,(segment->header_).p_offset,n);
    segment->contents_ = sVar14;
  }
  return;
}

Assistant:

void ElfFile::ReadSegment(Elf64_Word index, Segment* segment) const {
  if (index >= header_.e_phnum) {
    THROWF("segment $0 doesn't exist, only $1 segments", index,
           header_.e_phnum);
  }

  Elf64_Phdr* header = &segment->header_;
  ReadStruct<Elf32_Phdr>(
      entire_file(),
      CheckedAdd(header_.e_phoff, CheckedMul(header_.e_phentsize, index)),
      PhdrMunger(), &segment->range_, header);
  if (header->p_filesz > 0) {
    segment->contents_ = GetRegion(header->p_offset, header->p_filesz);
  }
}